

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

int __thiscall
cmMakefile::TryCompile
          (cmMakefile *this,string *srcdir,string *bindir,string *projectName,string *targetName,
          bool fast,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmakeArgs,string *output)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  cmGlobalGenerator *pcVar5;
  cmake *pcVar6;
  string *psVar7;
  cmGlobalGenerator *gen;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 collapse;
  allocator local_419;
  int ret;
  allocator local_3f1;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  allocator local_3a1;
  string local_3a0;
  allocator local_379;
  string local_378;
  char *local_358;
  char *config;
  string local_348;
  cmGlobalGenerator *local_328;
  cmGlobalGenerator *gg;
  cmake cm;
  undefined1 local_60 [8];
  string cwd;
  bool fast_local;
  string *targetName_local;
  string *projectName_local;
  string *bindir_local;
  string *srcdir_local;
  cmMakefile *this_local;
  
  this->IsSourceFileTryCompile = fast;
  cwd.field_2._M_local_buf[0xf] = fast;
  bVar1 = cmsys::SystemTools::FileIsDirectory(bindir);
  collapse = extraout_DL;
  if (!bVar1) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::MakeDirectory(pcVar4);
    collapse = extraout_DL_00;
  }
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)local_60,(SystemTools *)0x1,(bool)collapse);
  cmsys::SystemTools::ChangeDirectory(bindir);
  cmake::cmake((cmake *)&gg);
  cmake::SetIsInTryCompile((cmake *)&gg,true);
  pcVar5 = GetGlobalGenerator(this);
  (*pcVar5->_vptr_cmGlobalGenerator[3])(&local_348);
  pcVar5 = cmake::CreateGlobalGenerator((cmake *)&gg,&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  local_328 = pcVar5;
  if (pcVar5 == (cmGlobalGenerator *)0x0) {
    cmSystemTools::Error
              ("Internal CMake error, TryCompile bad GlobalGenerator",(char *)0x0,(char *)0x0,
               (char *)0x0);
    cmsys::SystemTools::ChangeDirectory((string *)local_60);
    this->IsSourceFileTryCompile = false;
    this_local._4_4_ = 1;
  }
  else {
    cmake::SetGlobalGenerator((cmake *)&gg,pcVar5);
    cmake::SetHomeDirectory((cmake *)&gg,srcdir);
    cmake::SetHomeOutputDirectory((cmake *)&gg,bindir);
    pcVar6 = GetCMakeInstance(this);
    psVar7 = cmake::GetGeneratorPlatform_abi_cxx11_(pcVar6);
    cmake::SetGeneratorPlatform((cmake *)&gg,psVar7);
    pcVar6 = GetCMakeInstance(this);
    psVar7 = cmake::GetGeneratorToolset_abi_cxx11_(pcVar6);
    cmake::SetGeneratorToolset((cmake *)&gg,psVar7);
    cmake::LoadCache((cmake *)&gg);
    uVar2 = (*local_328->_vptr_cmGlobalGenerator[0x1d])();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_378,"CMAKE_TRY_COMPILE_CONFIGURATION",&local_379);
      pcVar4 = GetDefinition(this,&local_378);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator((allocator<char> *)&local_379);
      local_358 = pcVar4;
      if (pcVar4 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3a0,"CMAKE_BUILD_TYPE",&local_3a1);
        cmake::AddCacheEntry((cmake *)&gg,&local_3a0,local_358,"Build configuration",3);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
      }
    }
    if (cmakeArgs !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      cmake::SetWarnUnusedCli((cmake *)&gg,false);
      cmake::SetCacheArgs((cmake *)&gg,cmakeArgs);
    }
    pcVar5 = local_328;
    gen = GetGlobalGenerator(this);
    cmGlobalGenerator::EnableLanguagesFromGenerator(pcVar5,gen,this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3c8,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_3c9);
    bVar1 = IsOn(this,&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3f0,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_3f1);
      cmake::AddCacheEntry((cmake *)&gg,&local_3f0,"TRUE","",4);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&ret,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_419);
      cmake::AddCacheEntry((cmake *)&gg,(string *)&ret,"FALSE","",4);
      std::__cxx11::string::~string((string *)&ret);
      std::allocator<char>::~allocator((allocator<char> *)&local_419);
    }
    iVar3 = cmake::Configure((cmake *)&gg);
    if (iVar3 == 0) {
      iVar3 = cmake::Generate((cmake *)&gg);
      if (iVar3 == 0) {
        pcVar5 = GetGlobalGenerator(this);
        this_local._4_4_ =
             cmGlobalGenerator::TryCompile
                       (pcVar5,srcdir,bindir,projectName,targetName,
                        (bool)(cwd.field_2._M_local_buf[0xf] & 1),output,this);
        cmsys::SystemTools::ChangeDirectory((string *)local_60);
        this->IsSourceFileTryCompile = false;
      }
      else {
        cmSystemTools::Error
                  ("Internal CMake error, TryCompile generation of cmake failed",(char *)0x0,
                   (char *)0x0,(char *)0x0);
        cmsys::SystemTools::ChangeDirectory((string *)local_60);
        this->IsSourceFileTryCompile = false;
        this_local._4_4_ = 1;
      }
    }
    else {
      cmSystemTools::Error
                ("Internal CMake error, TryCompile configure of cmake failed",(char *)0x0,
                 (char *)0x0,(char *)0x0);
      cmsys::SystemTools::ChangeDirectory((string *)local_60);
      this->IsSourceFileTryCompile = false;
      this_local._4_4_ = 1;
    }
  }
  config._4_4_ = 1;
  cmake::~cmake((cmake *)&gg);
  std::__cxx11::string::~string((string *)local_60);
  return this_local._4_4_;
}

Assistant:

int cmMakefile::TryCompile(const std::string& srcdir,
                           const std::string& bindir,
                           const std::string& projectName,
                           const std::string& targetName,
                           bool fast,
                           const std::vector<std::string> *cmakeArgs,
                           std::string& output)
{
  this->IsSourceFileTryCompile = fast;
  // does the binary directory exist ? If not create it...
  if (!cmSystemTools::FileIsDirectory(bindir))
    {
    cmSystemTools::MakeDirectory(bindir.c_str());
    }

  // change to the tests directory and run cmake
  // use the cmake object instead of calling cmake
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  cmSystemTools::ChangeDirectory(bindir);

  // make sure the same generator is used
  // use this program as the cmake to be run, it should not
  // be run that way but the cmake object requires a vailid path
  cmake cm;
  cm.SetIsInTryCompile(true);
  cmGlobalGenerator *gg = cm.CreateGlobalGenerator
    (this->GetGlobalGenerator()->GetName());
  if (!gg)
    {
    cmSystemTools::Error(
      "Internal CMake error, TryCompile bad GlobalGenerator");
    // return to the original directory
    cmSystemTools::ChangeDirectory(cwd);
    this->IsSourceFileTryCompile = false;
    return 1;
    }
  cm.SetGlobalGenerator(gg);

  // do a configure
  cm.SetHomeDirectory(srcdir);
  cm.SetHomeOutputDirectory(bindir);
  cm.SetGeneratorPlatform(this->GetCMakeInstance()->GetGeneratorPlatform());
  cm.SetGeneratorToolset(this->GetCMakeInstance()->GetGeneratorToolset());
  cm.LoadCache();
  if(!gg->IsMultiConfig())
    {
    if(const char* config =
       this->GetDefinition("CMAKE_TRY_COMPILE_CONFIGURATION"))
      {
      // Tell the single-configuration generator which one to use.
      // Add this before the user-provided CMake arguments in case
      // one of the arguments is -DCMAKE_BUILD_TYPE=...
      cm.AddCacheEntry("CMAKE_BUILD_TYPE", config,
                       "Build configuration", cmState::STRING);
      }
    }
  // if cmake args were provided then pass them in
  if (cmakeArgs)
    {
    // FIXME: Workaround to ignore unused CLI variables in try-compile.
    //
    // Ideally we should use SetArgs to honor options like --warn-unused-vars.
    // However, there is a subtle problem when certain arguments are passed to
    // a macro wrapping around try_compile or try_run that does not escape
    // semicolons in its parameters but just passes ${ARGV} or ${ARGN}.  In
    // this case a list argument like "-DVAR=a;b" gets split into multiple
    // cmake arguments "-DVAR=a" and "b".  Currently SetCacheArgs ignores
    // argument "b" and uses just "-DVAR=a", leading to a subtle bug in that
    // the try_compile or try_run does not get the proper value of VAR.  If we
    // call SetArgs here then it would treat "b" as the source directory and
    // cause an error such as "The source directory .../CMakeFiles/CMakeTmp/b
    // does not exist", thus breaking the try_compile or try_run completely.
    //
    // Strictly speaking the bug is in the wrapper macro because the CMake
    // language has always flattened nested lists and the macro should escape
    // the semicolons in its arguments before forwarding them.  However, this
    // bug is so subtle that projects typically work anyway, usually because
    // the value VAR=a is sufficient for the try_compile or try_run to get the
    // correct result.  Calling SetArgs here would break such projects that
    // previously built.  Instead we work around the issue by never reporting
    // unused arguments and ignoring options such as --warn-unused-vars.
    cm.SetWarnUnusedCli(false);
    //cm.SetArgs(*cmakeArgs, true);

    cm.SetCacheArgs(*cmakeArgs);
    }
  // to save time we pass the EnableLanguage info directly
  gg->EnableLanguagesFromGenerator(this->GetGlobalGenerator(), this);
  if(this->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS"))
    {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS",
                     "TRUE", "", cmState::INTERNAL);
    }
  else
    {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS",
                     "FALSE", "", cmState::INTERNAL);
    }
  if (cm.Configure() != 0)
    {
    cmSystemTools::Error(
      "Internal CMake error, TryCompile configure of cmake failed");
    // return to the original directory
    cmSystemTools::ChangeDirectory(cwd);
    this->IsSourceFileTryCompile = false;
    return 1;
    }

  if (cm.Generate() != 0)
    {
    cmSystemTools::Error(
      "Internal CMake error, TryCompile generation of cmake failed");
    // return to the original directory
    cmSystemTools::ChangeDirectory(cwd);
    this->IsSourceFileTryCompile = false;
    return 1;
    }

  // finally call the generator to actually build the resulting project
  int ret = this->GetGlobalGenerator()->TryCompile(srcdir,bindir,
                                                   projectName,
                                                   targetName,
                                                   fast,
                                                   output,
                                                   this);

  cmSystemTools::ChangeDirectory(cwd);
  this->IsSourceFileTryCompile = false;
  return ret;
}